

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void cleanup_messages(void)

{
  message *__ptr;
  message *pmVar1;
  long lVar2;
  long lVar3;
  
  __ptr = msghistory;
  lVar2 = (long)histsize;
  pmVar1 = msghistory;
  for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 1) {
    free(pmVar1->msg);
    pmVar1 = pmVar1 + 1;
  }
  free(__ptr);
  prevturn = L'\0';
  msghistory = (message *)0x0;
  last_redraw_curline = L'\0';
  curline = L'\0';
  start_of_turn_curline = L'\xffffffff';
  histpos = L'\0';
  histsize = L'\0';
  for (lVar2 = 0; lVar2 != 0xca8; lVar2 = lVar2 + 0x51) {
    msglines[0][lVar2] = '\0';
  }
  return;
}

Assistant:

void cleanup_messages(void)
{
    int i;

    for (i = 0; i < histsize; i++) {
	if (msghistory[i].msg)
	    free(msghistory[i].msg);
    }
    free(msghistory);
    prevturn = 0;

    /* extra cleanup to prevent old messages from appearing in a new game */
    msghistory = NULL;
    curline = last_redraw_curline = 0;
    start_of_turn_curline = -1;
    histsize = histpos = 0;
    for (i = 0; i < MAX_MSGLINES; i++)
	msglines[i][0] = '\0';
}